

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<char_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,char **needle,char **haystack)

{
  char *__haystack;
  size_t sVar1;
  String *extraout_RDX;
  String *extraout_RDX_00;
  char *pcVar3;
  ostream *poVar4;
  Message MVar5;
  bool bVar6;
  AssertionResult AVar7;
  Message local_40;
  char **local_38;
  scoped_ptr<testing::internal::String> sVar2;
  
  pcVar3 = *needle;
  __haystack = *haystack;
  local_38 = haystack;
  if (pcVar3 == (char *)0x0 || __haystack == (char *)0x0) {
    bVar6 = pcVar3 == __haystack;
    sVar2.ptr_ = (String *)needle_expr;
  }
  else {
    pcVar3 = strstr(__haystack,pcVar3);
    bVar6 = pcVar3 != (char *)0x0;
    sVar2.ptr_ = extraout_RDX;
  }
  if (bVar6 == expected_to_be_substring) {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    Message::Message(&local_40);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Value of: ",10);
    if (needle_expr == (char *)0x0) {
      MVar5.ss_ = local_40.ss_ + 0x10;
      sVar1 = 6;
      needle_expr = "(null)";
    }
    else {
      MVar5.ss_ = local_40.ss_;
      if (local_40.ss_ != (StrStream *)0x0) {
        MVar5.ss_ = (StrStream *)(local_40.ss_ + 0x10);
      }
      sVar1 = strlen(needle_expr);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar5.ss_,needle_expr,sVar1);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Actual: ",10);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    pcVar3 = *needle;
    if (pcVar3 == (char *)0x0) {
      MVar5.ss_ = local_40.ss_ + 0x10;
      sVar1 = 6;
      pcVar3 = "(null)";
    }
    else {
      MVar5.ss_ = local_40.ss_;
      if (local_40.ss_ != (StrStream *)0x0) {
        MVar5.ss_ = (StrStream *)(local_40.ss_ + 0x10);
      }
      sVar1 = strlen(pcVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar5.ss_,pcVar3,sVar1);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Expected: ",10);
    pcVar3 = "not ";
    if (expected_to_be_substring) {
      pcVar3 = "";
    }
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,pcVar3,(ulong)!expected_to_be_substring << 2);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"a substring of ",0xf);
    if (haystack_expr == (char *)0x0) {
      MVar5.ss_ = local_40.ss_ + 0x10;
      sVar1 = 6;
      haystack_expr = "(null)";
    }
    else {
      MVar5.ss_ = local_40.ss_;
      if (local_40.ss_ != (StrStream *)0x0) {
        MVar5.ss_ = (StrStream *)(local_40.ss_ + 0x10);
      }
      sVar1 = strlen(haystack_expr);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar5.ss_,haystack_expr,sVar1);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Which is: ",10);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    pcVar3 = *local_38;
    if (pcVar3 == (char *)0x0) {
      MVar5.ss_ = local_40.ss_ + 0x10;
      sVar1 = 6;
      pcVar3 = "(null)";
    }
    else {
      MVar5.ss_ = local_40.ss_;
      if (local_40.ss_ != (StrStream *)0x0) {
        MVar5.ss_ = (StrStream *)(local_40.ss_ + 0x10);
      }
      sVar1 = strlen(pcVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar5.ss_,pcVar3,sVar1);
    poVar4 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    AVar7 = AssertionFailure((testing *)this,&local_40);
    sVar2 = AVar7.message_.ptr_;
    if (local_40.ss_ != (StrStream *)0x0) {
      (**(code **)(*(long *)local_40.ss_ + 8))();
      sVar2.ptr_ = extraout_RDX_00;
    }
  }
  AVar7.message_.ptr_ = sVar2.ptr_;
  AVar7._0_8_ = this;
  return AVar7;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure(
      Message()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"");
}